

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_posix.cpp
# Opt level: O1

void __thiscall pstore::broker::gc_watch_thread::watcher(gc_watch_thread *this)

{
  long *plVar1;
  _Rb_tree_header *p_Var2;
  int __errnum;
  undefined8 *puVar3;
  pointer pcVar4;
  _Rb_tree_color _Var5;
  __pid_t _Var6;
  gc_watch_thread *pgVar7;
  not_null<const_char_*> nVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  int *piVar10;
  size_t sVar11;
  _Rb_tree_node_base *p_Var12;
  undefined8 uVar13;
  _Rb_tree_color _Var14;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_2;
  char *pcVar15;
  undefined8 *puVar16;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination_9;
  unique_ptr<pstore::logger,_std::default_delete<pstore::logger>_> *destination;
  long *in_FS_OFFSET;
  int status;
  __pid_t pid;
  unique_lock<std::mutex> lock;
  _Rb_tree_color local_1d8;
  __pid_t local_1d4;
  long *local_1d0;
  long local_1c8;
  long local_1c0 [2];
  gc_watch_thread *local_1b0;
  bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
  *local_1a8;
  not_null<const_char_*> local_198;
  long local_190;
  long local_188;
  long *local_180 [2];
  long local_170 [2];
  descriptor_condition_variable *local_160;
  unique_lock<std::mutex> local_158;
  not_null<const_char_*> local_148;
  not_null<const_char_*> local_140;
  char local_138 [264];
  
  local_140.ptr_ = "starting gc process watch thread";
  local_1b0 = this;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_140);
  nVar8.ptr_ = local_140.ptr_;
  pstore::details::log_destinations::__tls_init();
  plVar1 = (long *)(*in_FS_OFFSET + -8);
  if (*plVar1 != 0) {
    pstore::details::log_destinations::__tls_init();
    puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
    for (puVar16 = *(undefined8 **)*plVar1; puVar16 != puVar3; puVar16 = puVar16 + 1) {
      (**(code **)(*(long *)*puVar16 + 0x48))((long *)*puVar16,6,nVar8.ptr_);
    }
  }
  register_signal_handler(0x11,child_signal);
  pgVar7 = local_1b0;
  local_158._M_device = &local_1b0->mut_;
  local_158._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_158);
  local_158._M_owns = true;
  local_160 = &(pgVar7->cv_).cv_;
  local_1a8 = &pgVar7->processes_;
LAB_0011c979:
  do {
    do {
      local_198.ptr_ = "waiting for a GC process to complete";
      pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_198);
      nVar8.ptr_ = local_198.ptr_;
      pstore::details::log_destinations::__tls_init();
      if (*plVar1 != 0) {
        pstore::details::log_destinations::__tls_init();
        puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
        for (puVar16 = *(undefined8 **)*plVar1; puVar16 != puVar3; puVar16 = puVar16 + 1) {
          (**(code **)(*(long *)*puVar16 + 0x48))((long *)*puVar16,6,nVar8.ptr_);
        }
      }
      descriptor_condition_variable::wait(local_160,&local_158);
      if (local_1b0->done_ != false) {
        local_148.ptr_ = "cleaning up";
        pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_148);
        nVar8.ptr_ = local_148.ptr_;
        pstore::details::log_destinations::__tls_init();
        if (*plVar1 != 0) {
          pstore::details::log_destinations::__tls_init();
          puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
          for (puVar16 = *(undefined8 **)*plVar1; puVar16 != puVar3; puVar16 = puVar16 + 1) {
            (**(code **)(*(long *)*puVar16 + 0x48))((long *)*puVar16,6,nVar8.ptr_);
          }
        }
        p_Var12 = (local_1b0->processes_).right_._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        p_Var2 = &(local_1b0->processes_).right_._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var12 != p_Var2) {
          do {
            local_1d8 = p_Var12[1]._M_color;
            (*local_1b0->_vptr_gc_watch_thread[3])(local_1b0,&local_1d8);
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
          } while ((_Rb_tree_header *)p_Var12 != p_Var2);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_158);
        return;
      }
      local_1d8 = _S_red;
      while (local_1d4 = waitpid(-1,(int *)&local_1d8,3), local_1d4 != -1) {
        if (local_1d4 == 0) goto LAB_0011c979;
        pbVar9 = bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
                 ::getl(local_1a8,&local_1d4);
        local_180[0] = local_170;
        pcVar4 = (pbVar9->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_180,pcVar4,pcVar4 + pbVar9->_M_string_length);
        pstore::details::log_destinations::__tls_init();
        if (*plVar1 != 0) {
          pstore::details::log_destinations::__tls_init();
          puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
          for (puVar16 = *(undefined8 **)*plVar1; puVar16 != puVar3; puVar16 = puVar16 + 1) {
            (**(code **)(*(long *)*puVar16 + 0x50))
                      ((long *)*puVar16,6,"GC exited for ",local_180[0]);
          }
        }
        if (local_180[0] != local_170) {
          operator_delete(local_180[0],local_170[0] + 1);
        }
        _Var6 = local_1d4;
        _Var5 = local_1d8;
        pstore::details::log_destinations::__tls_init();
        if (*plVar1 != 0) {
          pstore::details::log_destinations::__tls_init();
          puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
          for (puVar16 = *(undefined8 **)*plVar1; puVar16 != puVar3; puVar16 = puVar16 + 1) {
            (**(code **)(*(long *)*puVar16 + 0x18))
                      ((long *)*puVar16,6,"GC process exited pid ",_Var6);
          }
        }
        _Var14 = _Var5 & 0x7f;
        if (_Var14 == _S_red) {
          pstore::details::log_destinations::__tls_init();
          if (*plVar1 != 0) {
            pstore::details::log_destinations::__tls_init();
            puVar16 = *(undefined8 **)*plVar1;
            puVar3 = (undefined8 *)((long *)*plVar1)[1];
            if (puVar16 != puVar3) {
              do {
                (**(code **)(*(long *)*puVar16 + 0x18))
                          ((long *)*puVar16,6,"Normal termination, exit status = ",_Var5 >> 8 & 0xff
                          );
                puVar16 = puVar16 + 1;
              } while (puVar16 != puVar3);
            }
          }
        }
        else if ((int)(_Var14 * 0x1000000 + 0x1000000) < 0x2000000) {
          if (((char)_Var5 == '\x7f') &&
             (pstore::details::log_destinations::__tls_init(), *plVar1 != 0)) {
            pstore::details::log_destinations::__tls_init();
            puVar16 = *(undefined8 **)*plVar1;
            puVar3 = (undefined8 *)((long *)*plVar1)[1];
            if (puVar16 != puVar3) {
              do {
                (**(code **)(*(long *)*puVar16 + 0x18))
                          ((long *)*puVar16,6,"Child stopped, signal number = ",_Var5 >> 8 & 0xff);
                puVar16 = puVar16 + 1;
              } while (puVar16 != puVar3);
            }
          }
        }
        else {
          pstore::details::log_destinations::__tls_init();
          if (*plVar1 != 0) {
            pstore::details::log_destinations::__tls_init();
            puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
            for (puVar16 = *(undefined8 **)*plVar1; puVar16 != puVar3; puVar16 = puVar16 + 1) {
              (**(code **)(*(long *)*puVar16 + 0x18))
                        ((long *)*puVar16,6,"Abormal termination, signal number ",_Var14);
            }
          }
          pcVar15 = "(core file generated)";
          if (-1 < (char)_Var5) {
            pcVar15 = "(no core file available)";
          }
          pstore::details::log_destinations::__tls_init();
          if (*plVar1 != 0) {
            pstore::details::log_destinations::__tls_init();
            puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
            for (puVar16 = *(undefined8 **)*plVar1; puVar16 != puVar3; puVar16 = puVar16 + 1) {
              (**(code **)(*(long *)*puVar16 + 0x50))((long *)*puVar16,6,"  ",pcVar15);
            }
          }
        }
        bimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<int>_>
        ::eraser<int>(local_1a8,&local_1d4);
      }
      piVar10 = __errno_location();
      __errnum = *piVar10;
    } while (__errnum == 10);
    local_138[0] = '\0';
    *piVar10 = 0;
    pcVar15 = strerror_r(__errnum,local_138,0x100);
    if (*piVar10 == 0) {
      local_1d0 = local_1c0;
      if (*pcVar15 == '\0') {
        local_190 = 0x17;
        local_1d0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_190);
        *local_1d0 = 0x73207974706d655b;
        local_1d0[1] = 0x657220676e697274;
        uVar13 = 0x5d64656e72757465;
        local_1c8 = local_190;
        goto LAB_0011cdb2;
      }
      sVar11 = strlen(pcVar15);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,pcVar15,pcVar15 + sVar11)
      ;
    }
    else {
      local_1d0 = local_1c0;
      local_188 = 0x17;
      local_1d0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_1d0,(ulong)&local_188);
      *local_1d0 = 0x20656c62616e755b;
      local_1d0[1] = 0x6d20746567206f74;
      uVar13 = 0x5d6567617373656d;
      local_1c8 = local_188;
LAB_0011cdb2:
      *(undefined8 *)((long)local_1d0 + 0xf) = uVar13;
      *(char *)((long)local_1d0 + local_1c8) = '\0';
      local_1c0[0] = local_1c8;
    }
    pstore::details::log_destinations::__tls_init();
    if (*plVar1 != 0) {
      pstore::details::log_destinations::__tls_init();
      puVar3 = (undefined8 *)((undefined8 *)*plVar1)[1];
      for (puVar16 = *(undefined8 **)*plVar1; puVar16 != puVar3; puVar16 = puVar16 + 1) {
        (**(code **)(*(long *)*puVar16 + 0x50))((long *)*puVar16,3,"waitpid error: ",local_1d0);
      }
    }
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
  } while( true );
}

Assistant:

void gc_watch_thread::watcher () {
            log (priority::info, "starting gc process watch thread");

            // Installing a global signal handler here is really somewhat antisocial. It would
            // overwrite a similar handler from another part of the system and it continues to be
            // active once this function returns.
            //
            // However, I'm comfortable enough with it at the moment that a more complex solution
            // is unnessary.
            register_signal_handler (SIGCHLD, &child_signal);

            std::unique_lock<decltype (mut_)> lock (mut_);
            for (;;) {
                try {
                    log (priority::info, "waiting for a GC process to complete");
                    cv_.wait (lock);
                    // There are two reasons that we may have been woken:
                    // - One (or more) of our child processes may have exited.
                    // - The program is exiting.
                    if (done_) {
                        break;
                    }

                    // Loop to ensure that we query all processes that exited whilst we were
                    // waiting.
                    auto status = 0;
                    while (auto const pid = ::waitpid (-1, &status, WUNTRACED | WNOHANG)) {
                        if (pid == -1) {
                            int const err = errno;
                            // If the error was "no child processes", we shouldn't report it.
                            if (err != ECHILD) {
                                log (priority::error, "waitpid error: ", string_error (err));
                            }
                            break;
                        }

                        std::string const & db_path = processes_.getl (pid);
                        log (priority::info, "GC exited for ", db_path);
                        // TODO: push a message to a channel which will tell a listener that this GC
                        // process has exited (and why)

                        pr_exit (pid, status); // Log the process exit.

                        processes_.eraser (pid); // Forget about the process.
                    }
                } catch (std::exception const & ex) {
                    log (priority::error, "An error occurred: ", ex.what ());
                    // TODO: delay before restarting. Don't restart after e.g. bad_alloc?
                } catch (...) {
                    log (priority::error, "Unknown error");
                    // TODO: delay before restarting
                }
            }

            // Ask any child GC processes to quit.
            log (priority::info, "cleaning up");
            std::for_each (processes_.right_begin (), processes_.right_end (),
                           [this] (pid_t const pid) { this->kill (pid); });
        }